

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LikeOptimizationRule::Apply
          (LikeOptimizationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  char cVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  BoundFunctionExpression *function;
  BoundConstantExpression *expr;
  ClientContext *context;
  BoundFunctionExpression *expr_00;
  reference args_1;
  reference args_2;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  ScalarFunction *this_00;
  long lVar12;
  ExpressionType local_461;
  _func_int **local_460;
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  LogicalType local_3f8;
  Value constant_value;
  ScalarFunction local_3a0;
  ScalarFunction local_278;
  ScalarFunction local_150;
  
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  function = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                       (&pvVar7->_M_data->super_BaseExpression);
  pvVar7 = vector<std::reference_wrapper<duckdb::Expression>,_true>::get<true>
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,2);
  expr = BaseExpression::Cast<duckdb::BoundConstantExpression>
                   (&pvVar7->_M_data->super_BaseExpression);
  if ((expr->value).is_null == true) {
    LogicalType::LogicalType(&local_3f8,&(function->super_Expression).return_type);
    Value::Value(&constant_value,&local_3f8);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_460,&constant_value);
    (this->super_Rule)._vptr_Rule = local_460;
    local_460 = (_func_int **)0x0;
    Value::~Value(&constant_value);
    LogicalType::~LogicalType(&local_3f8);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  iVar6 = (*(expr->super_Expression).super_BaseExpression._vptr_BaseExpression[0xf])(expr);
  if ((char)iVar6 == '\0') {
    (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  context = Rule::GetContext((Rule *)op);
  ExpressionExecutor::EvaluateScalar(&constant_value,context,&expr->super_Expression,false);
  expr_00 = (BoundFunctionExpression *)StringValue::Get_abi_cxx11_(&constant_value);
  bVar5 = ::std::operator==(&(function->function).super_BaseScalarFunction.super_SimpleFunction.
                             super_Function.name,"!~~");
  pp_Var2 = (expr_00->super_Expression).super_BaseExpression._vptr_BaseExpression;
  uVar3 = *(ulong *)&(expr_00->super_Expression).super_BaseExpression.type;
  for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    if ((*(char *)((long)pp_Var2 + uVar8) == '%') || (*(char *)((long)pp_Var2 + uVar8) == '_')) {
      if (uVar8 < uVar3) {
        lVar4 = 0;
        pp_Var11 = pp_Var2;
        goto LAB_015af5df;
      }
      break;
    }
  }
  local_461 = bVar5 + COMPARE_BOUNDARY_START;
  args_1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(&function->children,0);
  args_2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(&function->children,1);
  make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((duckdb *)&local_460,&local_461,args_1,args_2);
  (this->super_Rule)._vptr_Rule = local_460;
  goto LAB_015af673;
  while (lVar4 = lVar12 + 1, *(char *)((long)pp_Var11 + uVar3) == '%') {
LAB_015af5df:
    lVar12 = lVar4;
    pp_Var11 = (_func_int **)((long)pp_Var11 + -1);
    lVar9 = uVar3 - lVar12;
    if (lVar9 == 0) break;
  }
  if (lVar12 != 0) {
    do {
      if (lVar9 == 0) {
        PrefixFun::GetFunction();
        ::std::__cxx11::string::string(local_418,(string *)expr_00);
        ApplyRule(this,expr_00,(ScalarFunction *)function,(string *)&local_150,SUB81(local_418,0));
        ::std::__cxx11::string::~string(local_418);
        this_00 = &local_150;
        goto LAB_015af7fc;
      }
      cVar1 = *(char *)((long)pp_Var2 + lVar9 + -1);
    } while ((cVar1 != '%') && (lVar9 = lVar9 + -1, cVar1 != '_'));
  }
  for (uVar8 = 0;
      (uVar10 = uVar3, uVar3 != uVar8 && (uVar10 = uVar8, *(char *)((long)pp_Var2 + uVar8) == '%'));
      uVar8 = uVar8 + 1) {
  }
  if (uVar10 == 0) {
LAB_015af6b7:
    for (uVar8 = 0;
        (uVar10 = uVar3, uVar3 != uVar8 && (uVar10 = uVar8, *(char *)((long)pp_Var2 + uVar8) == '%')
        ); uVar8 = uVar8 + 1) {
    }
    lVar4 = 0;
    do {
      lVar9 = lVar4;
      uVar8 = uVar3;
      if (uVar8 == 0) break;
      uVar3 = uVar8 - 1;
      lVar4 = lVar9 + 1;
    } while (*(char *)((long)pp_Var2 + (uVar8 - 1)) == '%');
    if (lVar9 == 0 || uVar10 == 0) {
LAB_015af6f8:
      (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
      goto LAB_015af673;
    }
    for (; uVar10 < uVar8; uVar10 = uVar10 + 1) {
      if ((*(char *)((long)pp_Var2 + uVar10) == '%') || (*(char *)((long)pp_Var2 + uVar10) == '_'))
      goto LAB_015af6f8;
    }
    GetStringContains();
    ::std::__cxx11::string::string(local_458,(string *)expr_00);
    ApplyRule(this,expr_00,(ScalarFunction *)function,(string *)&local_3a0,SUB81(local_458,0));
    ::std::__cxx11::string::~string(local_458);
    this_00 = &local_3a0;
  }
  else {
    for (; uVar10 < uVar3; uVar10 = uVar10 + 1) {
      if ((*(char *)((long)pp_Var2 + uVar10) == '%') || (*(char *)((long)pp_Var2 + uVar10) == '_'))
      goto LAB_015af6b7;
    }
    SuffixFun::GetFunction();
    ::std::__cxx11::string::string(local_438,(string *)expr_00);
    ApplyRule(this,expr_00,(ScalarFunction *)function,(string *)&local_278,SUB81(local_438,0));
    ::std::__cxx11::string::~string(local_438);
    this_00 = &local_278;
  }
LAB_015af7fc:
  ScalarFunction::~ScalarFunction(this_00);
LAB_015af673:
  Value::~Value(&constant_value);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LikeOptimizationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                   bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant_expr = bindings[2].get().Cast<BoundConstantExpression>();
	D_ASSERT(root.children.size() == 2);

	if (constant_expr.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}

	// the constant_expr is a scalar expression that we have to fold
	if (!constant_expr.IsFoldable()) {
		return nullptr;
	}

	auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), constant_expr);
	D_ASSERT(constant_value.type() == constant_expr.return_type);
	auto &patt_str = StringValue::Get(constant_value);

	bool is_not_like = root.function.name == "!~~";
	if (PatternIsConstant(patt_str)) {
		// Pattern is constant
		return make_uniq<BoundComparisonExpression>(is_not_like ? ExpressionType::COMPARE_NOTEQUAL
		                                                        : ExpressionType::COMPARE_EQUAL,
		                                            std::move(root.children[0]), std::move(root.children[1]));
	} else if (PatternIsPrefix(patt_str)) {
		// Prefix LIKE pattern : [^%_]*[%]+, ignoring underscore
		return ApplyRule(root, PrefixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsSuffix(patt_str)) {
		// Suffix LIKE pattern: [%]+[^%_]*, ignoring underscore
		return ApplyRule(root, SuffixFun::GetFunction(), patt_str, is_not_like);
	} else if (PatternIsContains(patt_str)) {
		// Contains LIKE pattern: [%]+[^%_]*[%]+, ignoring underscore
		return ApplyRule(root, GetStringContains(), patt_str, is_not_like);
	}
	return nullptr;
}